

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

string * __thiscall iDynTree::Position::toString_abi_cxx11_(Position *this)

{
  ostream *poVar1;
  double *in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,*in_RSI);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,in_RSI[2]);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string Position::toString() const
    {
        std::stringstream ss;
        ss << this->m_data[0] << " " << this->m_data[1] << " " << this->m_data[2];
        return ss.str();
    }